

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O2

PSpriteAmiga __thiscall DataSourceAmiga::get_hud_sprite(DataSourceAmiga *this,size_t index)

{
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PSpriteAmiga PVar1;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  PBuffer data;
  
  Buffer::get_tail((Buffer *)&data,*(size_t *)(index + 0x1a8));
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,(__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)&data);
  decode_interlased_sprite
            (this,(PBuffer *)index,(size_t)&_Stack_48,
             hud_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[in_RDX * 4 + 2],
             (uint8_t)hud_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[in_RDX * 4 + 3],'\x10',(uint8_t *)0x0
             ,0x154fb0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PVar1.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar1.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar1.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::get_hud_sprite(size_t index) {
  PBuffer data = data_pointers[18]->get_tail(hud_offsets[index*4]);

  return decode_interlased_sprite(data, hud_offsets[index * 4 + 2],
                                  hud_offsets[index * 4 + 3], 16, 0, palette2);
}